

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiAxis axis)

{
  uint uVar1;
  float *pfVar2;
  uint in_EDI;
  bool bVar3;
  float _y;
  float fVar4;
  ImRect bb;
  ImDrawCornerFlags rounding_corners;
  float other_scrollbar_size;
  float scrollbar_size;
  float border_size;
  ImRect inner_rect;
  ImRect outer_rect;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ImGuiAxis in_stack_ffffffffffffff6c;
  ImGuiWindow *in_stack_ffffffffffffff70;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  uint local_4c;
  float local_48;
  float local_44;
  float local_40;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImRect local_2c;
  ImGuiID local_1c;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  uint local_4;
  
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  local_4 = in_EDI;
  local_1c = GetWindowScrollbarID(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  KeepAliveID(local_1c);
  local_2c = ImGuiWindow::Rect((ImGuiWindow *)0x2029cb);
  local_3c = (local_18->InnerRect).Min;
  local_34 = (local_18->InnerRect).Max;
  local_40 = local_18->WindowBorderSize;
  pfVar2 = ImVec2::operator[](&local_18->ScrollbarSizes,(long)(int)(local_4 ^ 1));
  local_44 = *pfVar2;
  pfVar2 = ImVec2::operator[](&local_18->ScrollbarSizes,(long)(int)local_4);
  local_48 = *pfVar2;
  local_4c = 0;
  if (local_48 <= 0.0) {
    local_4c = 8;
  }
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (local_4 == 0) {
    fVar4 = local_3c.x;
    _y = ImMax<float>(local_2c.Min.y,(local_2c.Max.y - local_40) - local_44);
    ImVec2::ImVec2(&local_64,fVar4,_y);
    local_5c = local_64;
    ImVec2::ImVec2(&local_6c,local_34.x,local_2c.Max.y);
    local_54 = local_6c;
    local_4c = local_4c | 4;
  }
  else {
    fVar4 = ImMax<float>(local_2c.Min.x,(local_2c.Max.x - local_40) - local_44);
    ImVec2::ImVec2(&local_74,fVar4,local_3c.y);
    local_5c = local_74;
    ImVec2::ImVec2(&local_7c,local_2c.Max.x,(local_18->InnerRect).Max.y);
    local_54 = local_7c;
    bVar3 = false;
    if ((local_18->Flags & 1U) != 0) {
      bVar3 = (local_18->Flags & 0x400U) == 0;
    }
    uVar1 = 0;
    if (bVar3) {
      uVar1 = 2;
    }
    local_4c = uVar1 | local_4c;
  }
  ImVec2::operator[](&local_18->Scroll,(long)(int)local_4);
  ImVec2::operator[](&local_34,(long)(int)local_4);
  ImVec2::operator[](&local_3c,(long)(int)local_4);
  ImVec2::operator[](&local_18->ContentSize,(long)(int)local_4);
  ImVec2::operator[](&local_18->WindowPadding,(long)(int)local_4);
  ScrollbarEx(_border_size,(ImGuiID)scrollbar_size,(ImGuiAxis)other_scrollbar_size,stack0x00000058,
              bb.Max.x,bb.Min.y,(ImDrawCornerFlags)bb.Min.x);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1];
    IM_ASSERT(scrollbar_size > 0.0f);
    const float other_scrollbar_size = window->ScrollbarSizes[axis];
    ImDrawCornerFlags rounding_corners = (other_scrollbar_size <= 0.0f) ? ImDrawCornerFlags_BotRight : 0;
    ImRect bb;
    if (axis == ImGuiAxis_X)
    {
        bb.Min = ImVec2(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size));
        bb.Max = ImVec2(inner_rect.Max.x, outer_rect.Max.y);
        rounding_corners |= ImDrawCornerFlags_BotLeft;
    }
    else
    {
        bb.Min = ImVec2(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y);
        bb.Max = ImVec2(outer_rect.Max.x, window->InnerRect.Max.y);
        rounding_corners |= ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0;
    }
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], inner_rect.Max[axis] - inner_rect.Min[axis], window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f, rounding_corners);
}